

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2d1e6d::LaneBasedExecutionQueue::~LaneBasedExecutionQueue
          (LaneBasedExecutionQueue *this)

{
  Scheduler *pSVar1;
  uint i;
  uint uVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  (this->super_ExecutionQueue)._vptr_ExecutionQueue =
       (_func_int **)&PTR__LaneBasedExecutionQueue_00203a68;
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->readyJobsMutex);
  this->shutdown = true;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  for (uVar2 = 0; uVar2 != this->numLanes; uVar2 = uVar2 + 1) {
    std::thread::join();
  }
  std::mutex::lock(&this->killAfterTimeoutThreadMutex);
  if ((this->killAfterTimeoutThread)._M_t.
      super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
      super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
      super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
    std::unique_lock<std::mutex>::unique_lock(&local_40,&this->queueCompleteMutex);
    this->queueComplete = true;
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    std::thread::join();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->killAfterTimeoutThreadMutex);
  std::condition_variable::~condition_variable(&this->queueCompleteCondition);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            (&this->killAfterTimeoutThread);
  llbuild::basic::ProcessGroup::~ProcessGroup(&this->spawnedProcesses);
  std::condition_variable::~condition_variable(&this->readyJobsCondition);
  FifoScheduler::~FifoScheduler(&this->readyPriorityJobs);
  pSVar1 = (this->readyJobs)._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::Scheduler,_std::default_delete<(anonymous_namespace)::Scheduler>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::Scheduler_*,_std::default_delete<(anonymous_namespace)::Scheduler>_>
           .super__Head_base<0UL,_(anonymous_namespace)::Scheduler_*,_false>._M_head_impl;
  if (pSVar1 != (Scheduler *)0x0) {
    (*pSVar1->_vptr_Scheduler[1])();
  }
  (this->readyJobs)._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::Scheduler,_std::default_delete<(anonymous_namespace)::Scheduler>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::Scheduler_*,_std::default_delete<(anonymous_namespace)::Scheduler>_>
  .super__Head_base<0UL,_(anonymous_namespace)::Scheduler_*,_false>._M_head_impl = (Scheduler *)0x0;
  std::
  vector<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ::~vector(&this->lanes);
  llbuild::basic::ExecutionQueue::~ExecutionQueue(&this->super_ExecutionQueue);
  return;
}

Assistant:

virtual ~LaneBasedExecutionQueue() {
    // Shut down the lanes.
    {
      std::unique_lock<std::mutex> lock(readyJobsMutex);
      shutdown = true;
      readyJobsCondition.notify_all();
    }

    for (unsigned i = 0; i != numLanes; ++i) {
      lanes[i]->join();
    }

    {
      std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
      if (killAfterTimeoutThread) {
        {
          std::unique_lock<std::mutex> lock(queueCompleteMutex);
          queueComplete = true;
          queueCompleteCondition.notify_all();
        }
        killAfterTimeoutThread->join();
      }
    }
  }